

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O3

bool test_uintwide_t_edge::test_import_bits(void)

{
  short *psVar1;
  short *psVar2;
  undefined2 uVar3;
  undefined8 uVar4;
  size_t __n;
  _Alloc_hider _Var5;
  enable_if_t<std::is_integral<unsigned_int>::value,_bool> eVar6;
  int iVar7;
  int iVar8;
  unsigned_long uVar9;
  undefined2 *puVar10;
  uint uVar11;
  ulong uVar12;
  undefined2 *puVar13;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_00;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_01;
  ulong uVar14;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_02;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_03;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_04;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_05;
  uintwide_t<256U,_unsigned_short,_void,_false> *extraout_RDX_06;
  uintwide_t<256U,_unsigned_short,_void,_false> *puVar15;
  bool bVar16;
  uint i;
  uint uVar17;
  long lVar18;
  undefined8 *puVar19;
  uint i_1;
  undefined8 unaff_R13;
  iterator __end4;
  uint uVar20;
  bool bVar21;
  local_boost_small_uint_type val_boost;
  string str_uintwide_t;
  local_double_width_input_array_type bits_double_width;
  string str_boost;
  local_representation_type bits;
  string str_boost_2;
  uintwide_t<256U,_unsigned_short,_void,_false> u_gen;
  false_ local_139;
  ulong local_138;
  long local_130;
  data_type local_128;
  ulong local_108;
  string local_f8;
  string local_d8;
  string local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  long local_78;
  string local_70;
  uintwide_t<256U,_unsigned_short,_void,_false> local_50;
  
  uVar9 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  uVar12 = 0x12dd397;
  if (uVar9 != 0) {
    uVar12 = uVar9 % 0x7fffffab + (ulong)(uVar9 % 0x7fffffab == 0);
  }
  lVar18 = 0;
  puVar19 = &eng_sgn;
  do {
    uVar12 = (uVar12 * 0x9c4e) % 0x7fffffab;
    *(ulong *)((long)&eng_sgn + lVar18) = (ulong)((uint)uVar12 & 0xffffff);
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0xc0);
  _DAT_0020b3e8 = (ulong)(DAT_0020b3e0 == 0);
  _DAT_0020b3f0 = 0;
  uRam000000000020b3f8 = 0;
  uVar9 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
  std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>::seed
            ((subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL> *)&eng_dig,uVar9);
  _DAT_0020b470 = 0;
  uVar12 = CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  local_138 = 0;
  do {
    uVar17 = 0;
    do {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                (&local_50,(test_uintwide_t_edge *)0x1,false,0x4d,(int)puVar19);
      local_98 = (pointer)CONCAT44(local_50.values.super_array<unsigned_short,_16UL>.elems._4_4_,
                                   local_50.values.super_array<unsigned_short,_16UL>.elems._0_4_);
      uStack_90._0_2_ = local_50.values.super_array<unsigned_short,_16UL>.elems[4];
      uStack_90._2_2_ = local_50.values.super_array<unsigned_short,_16UL>.elems[5];
      uStack_90._4_2_ = local_50.values.super_array<unsigned_short,_16UL>.elems[6];
      uStack_90._6_2_ = local_50.values.super_array<unsigned_short,_16UL>.elems[7];
      local_88._0_2_ = local_50.values.super_array<unsigned_short,_16UL>.elems[8];
      local_88._2_2_ = local_50.values.super_array<unsigned_short,_16UL>.elems[9];
      local_88._4_2_ = local_50.values.super_array<unsigned_short,_16UL>.elems[10];
      local_88._6_2_ = local_50.values.super_array<unsigned_short,_16UL>.elems[0xb];
      uStack_80._0_2_ = local_50.values.super_array<unsigned_short,_16UL>.elems[0xc];
      uStack_80._2_2_ = local_50.values.super_array<unsigned_short,_16UL>.elems[0xd];
      uStack_80._4_2_ = local_50.values.super_array<unsigned_short,_16UL>.elems[0xe];
      uStack_80._6_2_ = local_50.values.super_array<unsigned_short,_16UL>.elems[0xf];
      bVar16 = test_import_bits::msv_options._M_elems[local_138];
      if (bVar16 == true) {
        puVar13 = (undefined2 *)((long)&uStack_80 + 6);
        puVar10 = (undefined2 *)((long)&local_98 + 2);
        do {
          uVar3 = puVar10[-1];
          puVar10[-1] = *puVar13;
          *puVar13 = uVar3;
          puVar13 = puVar13 + -1;
          bVar21 = puVar10 < puVar13;
          puVar10 = puVar10 + 1;
        } while (bVar21);
      }
      local_d8.field_2._M_allocated_capacity = 0;
      local_d8.field_2._8_8_ = 0;
      local_d8._M_dataplus._M_p = (pointer)0x0;
      local_d8._M_string_length = 0;
      local_128.m_data[2]._0_2_ = 0;
      local_128.m_data[2]._2_2_ = 0;
      local_128.m_data[2]._4_2_ = 0;
      local_128.m_data[2]._6_2_ = 0;
      local_128.m_data[3]._0_2_ = 0;
      local_128.m_data[3]._2_2_ = 0;
      local_128.m_data[3]._4_2_ = 0;
      local_128.m_data[3]._6_2_ = 0;
      local_128.m_data[0] = 0;
      local_128.m_data[1]._0_2_ = 0;
      local_128.m_data[1]._2_2_ = 0;
      local_128.m_data[1]._4_2_ = 0;
      local_128.m_data[1]._6_2_ = 0;
      local_108 = 1;
      uVar20 = (~uVar17 & 1) << 4;
      puVar19 = (undefined8 *)(ulong)bVar16;
      math::wide_integer::import_bits<const_unsigned_short_*,_256U,_unsigned_short,_void,_nullptr>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_d8,
                 (unsigned_short *)&local_98,(unsigned_short *)&local_78,uVar20,bVar16);
      if (bVar16 == false) {
        local_108 = 4;
        local_128.m_data[0] = (limb_type)local_98;
        local_128.m_data[1]._0_2_ = (value_type_conflict3)uStack_90;
        local_128.m_data[1]._2_2_ = uStack_90._2_2_;
        local_128.m_data[1]._4_2_ = uStack_90._4_2_;
        local_128.m_data[1]._6_2_ = uStack_90._6_2_;
        local_128.m_data[2]._0_2_ = (value_type_conflict3)local_88;
        local_128.m_data[2]._2_2_ = local_88._2_2_;
        local_128.m_data[2]._4_2_ = local_88._4_2_;
        local_128.m_data[2]._6_2_ = local_88._6_2_;
        local_128.m_data[3]._0_2_ = (value_type_conflict3)uStack_80;
        local_128.m_data[3]._2_2_ = uStack_80._2_2_;
        local_128.m_data[3]._4_2_ = uStack_80._4_2_;
        local_128.m_data[3]._6_2_ = uStack_80._6_2_;
        uVar14 = 3;
        do {
          puVar15 = extraout_RDX;
          if (*(long *)((long)&local_128 + uVar14 * 8) != 0) break;
          local_108 = uVar14;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
      }
      else {
        puVar19 = (undefined8 *)0x1;
        boost::multiprecision::detail::
        import_bits_generic<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_short_const*>
                  ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_128,(unsigned_short *)&local_98,(unsigned_short *)&local_78,uVar20,true
                  );
        puVar15 = extraout_RDX_00;
      }
      math::wide_integer::to_string<256u,unsigned_short,void,false>
                (&local_f8,(wide_integer *)&local_d8,puVar15);
      boost::multiprecision::backends::
      cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
      ::do_get_string_abi_cxx11_
                (&local_b8,
                 (cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                  *)&local_128,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max),(false_ *)&local_70);
      if (local_f8._M_string_length ==
          CONCAT44(local_b8._M_string_length._4_4_,(undefined4)local_b8._M_string_length)) {
        if (local_f8._M_string_length != 0) {
          iVar7 = bcmp(local_f8._M_dataplus._M_p,local_b8._M_dataplus._M_p,local_f8._M_string_length
                      );
          if (iVar7 != 0) goto LAB_00116dd1;
        }
        lVar18 = 0x1e;
        do {
          if (lVar18 == -2) goto LAB_00116dd4;
          psVar2 = (short *)((long)local_50.values.super_array<unsigned_short,_16UL>.elems + lVar18)
          ;
          psVar1 = (short *)((long)&local_d8._M_dataplus._M_p + lVar18);
          lVar18 = lVar18 + -2;
        } while (*psVar2 == *psVar1);
      }
LAB_00116dd1:
      uVar12 = 0;
LAB_00116dd4:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                                 local_b8.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != 0x40);
    local_138 = local_138 + 1;
    if (local_138 == 2) {
      local_138 = uVar12 & 0xffffffff;
      local_78 = 0;
      do {
        local_130 = 0;
        do {
          iVar7 = 0;
          do {
            generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                      (&local_50,(test_uintwide_t_edge *)0x1,false,0x4d,(int)puVar19);
            bVar16 = test_import_bits::msv_options._M_elems[local_78];
            if (bVar16 == true) {
              puVar13 = (undefined2 *)((long)&uStack_80 + 6);
              puVar10 = (undefined2 *)((long)&local_98 + 2);
              do {
                uVar3 = puVar10[-1];
                puVar10[-1] = *puVar13;
                *puVar13 = uVar3;
                puVar13 = puVar13 + -1;
                bVar21 = puVar10 < puVar13;
                puVar10 = puVar10 + 1;
              } while (bVar21);
            }
            local_d8.field_2._M_allocated_capacity = 0;
            local_d8.field_2._8_8_ = 0;
            local_d8._M_dataplus._M_p = (pointer)0x0;
            local_d8._M_string_length = 0;
            local_128.m_data[2]._0_2_ = 0;
            local_128.m_data[2]._2_2_ = 0;
            local_128.m_data[2]._4_2_ = 0;
            local_128.m_data[2]._6_2_ = 0;
            local_128.m_data[3]._0_2_ = 0;
            local_128.m_data[3]._2_2_ = 0;
            local_128.m_data[3]._4_2_ = 0;
            local_128.m_data[3]._6_2_ = 0;
            local_128.m_data[0] = 0;
            local_128.m_data[1]._0_2_ = 0;
            local_128.m_data[1]._2_2_ = 0;
            local_128.m_data[1]._4_2_ = 0;
            local_128.m_data[1]._6_2_ = 0;
            local_108 = 1;
            uVar17 = *(uint *)((long)test_import_bits::bits_for_chunks._M_elems + local_130);
            puVar19 = (undefined8 *)(ulong)(uint)bVar16;
            math::wide_integer::
            import_bits<const_unsigned_short_*,_256U,_unsigned_short,_void,_nullptr>
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_d8,
                       (unsigned_short *)&local_98,(unsigned_short *)&local_78,uVar17,bVar16);
            if ((uVar17 & 7) == 0 && bVar16 == false) {
              uVar12 = (ulong)(uVar17 >> 3);
              if (uVar17 == 0) {
                uVar12 = 2;
              }
              uVar17 = (int)uVar12 * 2;
              local_108 = (ulong)uVar17;
              if (3 < uVar17) {
                local_108 = 4;
              }
              *(undefined8 *)((long)&local_128 + (ulong)((int)local_108 - 1) * 8) = 0;
              uVar14 = (local_108 & 0xffffffff) << 3;
              if (uVar12 << 4 <= uVar14) {
                uVar14 = uVar12 << 4;
              }
              memcpy(&local_128,&local_98,uVar14);
              while ((uVar12 = local_108 - 1, puVar15 = extraout_RDX_02, uVar12 != 0 &&
                     (*(long *)((long)&local_128 + uVar12 * 8) == 0))) {
                local_108 = uVar12;
              }
            }
            else {
              puVar19 = (undefined8 *)(ulong)(uint)bVar16;
              boost::multiprecision::detail::
              import_bits_generic<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_short_const*>
                        ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_128,(unsigned_short *)&local_98,(unsigned_short *)&local_78,
                         uVar17,bVar16);
              puVar15 = extraout_RDX_01;
            }
            math::wide_integer::to_string<256u,unsigned_short,void,false>
                      (&local_f8,(wide_integer *)&local_d8,puVar15);
            boost::multiprecision::backends::
            cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
            ::do_get_string_abi_cxx11_
                      (&local_b8,
                       (cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                        *)&local_128,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max),(false_ *)&local_70)
            ;
            _Var5._M_p = local_b8._M_dataplus._M_p;
            if (local_f8._M_string_length ==
                CONCAT44(local_b8._M_string_length._4_4_,(undefined4)local_b8._M_string_length)) {
              if (local_f8._M_string_length != 0) {
                iVar8 = bcmp(local_f8._M_dataplus._M_p,local_b8._M_dataplus._M_p,
                             local_f8._M_string_length);
                local_138 = CONCAT44(local_138._4_4_,
                                     CONCAT31((int3)((uint)iVar8 >> 8),iVar8 == 0 & (byte)local_138)
                                    );
              }
            }
            else {
              local_138 = local_138 & 0xffffffff00000000;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var5._M_p != &local_b8.field_2) {
              operator_delete(_Var5._M_p,
                              CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                                       local_b8.field_2._M_allocated_capacity._0_4_) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            iVar7 = iVar7 + 1;
          } while (iVar7 != 0x40);
          local_130 = local_130 + 4;
        } while (local_130 != 0xc);
        local_78 = local_78 + 1;
      } while (local_78 != 2);
      local_130 = 0;
      local_78 = 2;
      do {
        iVar7 = 0;
        do {
          generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                    (&local_50,(test_uintwide_t_edge *)0x1,false,0x4d,(int)puVar19);
          local_98 = (pointer)CONCAT44(local_50.values.super_array<unsigned_short,_16UL>.elems._4_4_
                                       ,local_50.values.super_array<unsigned_short,_16UL>.elems.
                                        _0_4_);
          uStack_90 = CONCAT44(local_50.values.super_array<unsigned_short,_16UL>.elems._12_4_,
                               local_50.values.super_array<unsigned_short,_16UL>.elems._8_4_);
          local_88 = CONCAT44(local_50.values.super_array<unsigned_short,_16UL>.elems._20_4_,
                              local_50.values.super_array<unsigned_short,_16UL>.elems._16_4_);
          uStack_80 = CONCAT44(local_50.values.super_array<unsigned_short,_16UL>.elems._28_4_,
                               local_50.values.super_array<unsigned_short,_16UL>.elems._24_4_);
          lVar18 = 0;
          do {
            uVar4 = *(undefined8 *)((long)&uStack_90 + lVar18 * 4);
            *(undefined8 *)((long)&local_d8._M_dataplus._M_p + lVar18 * 4) =
                 *(undefined8 *)((long)&local_98 + lVar18 * 4);
            *(undefined8 *)((long)&local_d8._M_string_length + lVar18 * 4) = uVar4;
            lVar18 = lVar18 + 4;
          } while (lVar18 != 8);
          local_f8.field_2._M_allocated_capacity = 0;
          local_f8.field_2._8_8_ = 0;
          local_f8._M_dataplus._M_p = (pointer)0x0;
          local_f8._M_string_length = 0;
          local_128.m_data[2]._0_2_ = 0;
          local_128.m_data[2]._2_2_ = 0;
          local_128.m_data[2]._4_2_ = 0;
          local_128.m_data[2]._6_2_ = 0;
          local_128.m_data[3]._0_2_ = 0;
          local_128.m_data[3]._2_2_ = 0;
          local_128.m_data[3]._4_2_ = 0;
          local_128.m_data[3]._6_2_ = 0;
          local_128.m_data[0] = 0;
          local_128.m_data[1]._0_2_ = 0;
          local_128.m_data[1]._2_2_ = 0;
          local_128.m_data[1]._4_2_ = 0;
          local_128.m_data[1]._6_2_ = 0;
          local_108 = 1;
          bVar16 = test_import_bits::msv_options._M_elems[local_130];
          puVar19 = (undefined8 *)(ulong)bVar16;
          math::wide_integer::import_bits<const_unsigned_int_*,_256U,_unsigned_short,_void,_nullptr>
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_f8,(uint *)&local_d8,
                     (uint *)&local_b8,0x20,bVar16);
          if (bVar16 == false) {
            local_108 = 4;
            local_128.m_data[0] = (limb_type)local_d8._M_dataplus._M_p;
            local_128.m_data[1]._0_4_ = (undefined4)local_d8._M_string_length;
            local_128.m_data[1]._4_4_ = (undefined4)(local_d8._M_string_length >> 0x20);
            local_128.m_data[2]._0_4_ = (undefined4)local_d8.field_2._M_allocated_capacity;
            local_128.m_data[2]._4_4_ = (undefined4)((ulong)local_d8.field_2._0_8_ >> 0x20);
            local_128.m_data[3]._0_4_ = (undefined4)local_d8.field_2._8_8_;
            local_128.m_data[3]._4_4_ = (undefined4)((ulong)local_d8.field_2._8_8_ >> 0x20);
            uVar12 = 3;
            do {
              puVar15 = extraout_RDX_03;
              if (*(long *)((long)&local_128 + uVar12 * 8) != 0) break;
              local_108 = uVar12;
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          else {
            puVar19 = (undefined8 *)0x1;
            boost::multiprecision::detail::
            import_bits_generic<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int_const*>
                      ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_128,(uint *)&local_d8,(uint *)&local_b8,0x20,true);
            puVar15 = extraout_RDX_04;
          }
          math::wide_integer::to_string<256u,unsigned_short,void,false>
                    (&local_b8,(wide_integer *)&local_f8,puVar15);
          boost::multiprecision::backends::
          cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
          ::do_get_string_abi_cxx11_
                    (&local_70,
                     (cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                      *)&local_128,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max),&local_139);
          _Var5._M_p = local_70._M_dataplus._M_p;
          __n = CONCAT44(local_b8._M_string_length._4_4_,(undefined4)local_b8._M_string_length);
          if (__n == CONCAT44(local_70._M_string_length._4_4_,(undefined4)local_70._M_string_length)
             ) {
            if (__n != 0) {
              iVar8 = bcmp(local_b8._M_dataplus._M_p,local_70._M_dataplus._M_p,__n);
              local_138 = CONCAT44(local_138._4_4_,
                                   CONCAT31((int3)((uint)iVar8 >> 8),iVar8 == 0 & (byte)local_138));
            }
          }
          else {
            local_138 = local_138 & 0xffffffff00000000;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var5._M_p != &local_70.field_2) {
            operator_delete(_Var5._M_p,
                            CONCAT44(local_70.field_2._M_allocated_capacity._4_4_,
                                     local_70.field_2._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,
                            CONCAT44(local_b8.field_2._M_allocated_capacity._4_4_,
                                     local_b8.field_2._M_allocated_capacity._0_4_) + 1);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 != 0x40);
        local_130 = local_130 + 1;
      } while (local_130 != 2);
      local_130 = 0;
      do {
        iVar7 = 0;
        do {
          generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                    (&local_50,(test_uintwide_t_edge *)0x1,false,0x4d,(int)puVar19);
          lVar18 = 0;
          do {
            *(undefined4 *)((long)&local_70._M_dataplus._M_p + lVar18) =
                 *(undefined4 *)((long)&local_b8._M_dataplus._M_p + lVar18);
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0x1c);
          local_88 = 0;
          uStack_80 = 0;
          local_98 = (pointer)0x0;
          uStack_90 = 0;
          local_128.m_data[2]._0_2_ = 0;
          local_128.m_data[2]._2_2_ = 0;
          local_128.m_data[2]._4_2_ = 0;
          local_128.m_data[2]._6_2_ = 0;
          local_128.m_data[3]._0_2_ = 0;
          local_128.m_data[3]._2_2_ = 0;
          local_128.m_data[3]._4_2_ = 0;
          local_128.m_data[3]._6_2_ = 0;
          local_128.m_data[0] = 0;
          local_128.m_data[1]._0_2_ = 0;
          local_128.m_data[1]._2_2_ = 0;
          local_128.m_data[1]._4_2_ = 0;
          local_128.m_data[1]._6_2_ = 0;
          local_108 = 1;
          bVar16 = test_import_bits::msv_options._M_elems[local_130];
          puVar19 = (undefined8 *)(ulong)bVar16;
          math::wide_integer::import_bits<const_unsigned_int_*,_256U,_unsigned_short,_void,_nullptr>
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_98,(uint *)&local_70,
                     (uint *)(local_70.field_2._M_local_buf + 0xc),0x20,bVar16);
          if (bVar16 == false) {
            local_108 = 4;
            local_128.m_data[3]._4_2_ = 0;
            local_128.m_data[3]._6_2_ = 0;
            local_128.m_data[2]._0_4_ = local_70.field_2._M_allocated_capacity._0_4_;
            local_128.m_data[2]._4_4_ = local_70.field_2._M_allocated_capacity._4_4_;
            local_128.m_data[3]._0_4_ = local_70.field_2._8_4_;
            local_128.m_data[0] = (limb_type)local_70._M_dataplus._M_p;
            local_128.m_data[1]._0_2_ = (value_type_conflict3)local_70._M_string_length;
            local_128.m_data[1]._2_2_ = local_70._M_string_length._2_2_;
            local_128.m_data[1]._4_2_ = local_70._M_string_length._4_2_;
            local_128.m_data[1]._6_2_ = local_70._M_string_length._6_2_;
            uVar12 = 3;
            do {
              puVar15 = extraout_RDX_05;
              if (*(long *)((long)&local_128 + uVar12 * 8) != 0) break;
              local_108 = uVar12;
              uVar12 = uVar12 - 1;
            } while (uVar12 != 0);
          }
          else {
            puVar19 = (undefined8 *)0x1;
            boost::multiprecision::detail::
            import_bits_generic<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void,(boost::multiprecision::expression_template_option)0,unsigned_int_const*>
                      ((number<boost::multiprecision::backends::cpp_int_backend<256U,_256U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_128,(uint *)&local_70,(uint *)(local_70.field_2._M_local_buf + 0xc)
                       ,0x20,true);
            puVar15 = extraout_RDX_06;
          }
          math::wide_integer::to_string<256u,unsigned_short,void,false>
                    (&local_d8,(wide_integer *)&local_98,puVar15);
          boost::multiprecision::backends::
          cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
          ::do_get_string_abi_cxx11_
                    (&local_f8,
                     (cpp_int_backend<256u,256u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>
                      *)&local_128,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max),&local_139);
          _Var5._M_p = local_f8._M_dataplus._M_p;
          if (local_d8._M_string_length == local_f8._M_string_length) {
            if (local_d8._M_string_length != 0) {
              iVar8 = bcmp(local_d8._M_dataplus._M_p,local_f8._M_dataplus._M_p,
                           local_d8._M_string_length);
              local_138 = CONCAT44(local_138._4_4_,
                                   CONCAT31((int3)((uint)iVar8 >> 8),iVar8 == 0 & (byte)local_138));
            }
          }
          else {
            local_138 = local_138 & 0xffffffff00000000;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var5._M_p != &local_f8.field_2) {
            operator_delete(_Var5._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 != 0x40);
        local_130 = local_130 + 1;
        if (local_130 == 2) {
          local_50.values.super_array<unsigned_short,_16UL>.elems[0] = 0xaaaa;
          local_50.values.super_array<unsigned_short,_16UL>.elems[1] = 0x5555;
          lVar18 = 0;
          local_130 = 2;
          uVar17 = (uint)local_138;
          do {
            uVar20 = *(uint *)((long)test_import_bits::various_chunk_sizes._M_elems + lVar18);
            local_128.m_data[2]._0_4_ = 0;
            local_128.m_data[2]._4_4_ = 0;
            local_128.m_data[3]._0_4_ = 0;
            local_128.m_data[3]._4_4_ = 0;
            uVar11 = 0x20;
            if (uVar20 < 0x20) {
              uVar11 = uVar20;
            }
            local_128.m_data[0] = 0;
            local_128.m_data[1]._0_4_ = 0;
            local_128.m_data[1]._4_4_ = 0;
            if (uVar20 == 0) {
              uVar11 = 0x20;
            }
            math::wide_integer::detail::
            import_export_helper<unsigned_int_const*,math::wide_integer::detail::iterator_detail::reverse_iterator<unsigned_short*>>
                      ((uint *)&local_50,
                       (unsigned_short *)
                       ((long)&local_128 +
                       (ulong)((uVar11 & 0xf) != 0) * 2 + (ulong)(uVar11 >> 3 & 6)),(ulong)uVar11,
                       (ulong)uVar11,0x10);
            eVar6 = math::wide_integer::operator==
                              ((uintwide_t<256U,_unsigned_short,_void,_false> *)&local_128,
                               (uint *)((long)test_import_bits::various_import_results._M_elems +
                                       lVar18));
            bVar16 = (bool)((byte)uVar17 & eVar6);
            uVar17 = (uint)bVar16;
            lVar18 = lVar18 + 4;
          } while (lVar18 != 0x10);
          return bVar16;
        }
      } while( true );
    }
  } while( true );
}

Assistant:

auto test_import_bits() -> bool // NOLINT(readability-function-cognitive-complexity)
{
  eng_sgn.seed(util::util_pseudorandom_time_point_seed::value<typename eng_sgn_type::result_type>());
  eng_dig.seed(util::util_pseudorandom_time_point_seed::value<typename eng_dig_type::result_type>());

  using local_boost_small_uint_backend_type =
    boost::multiprecision::cpp_int_backend<local_edge_cases::local_digits2_small,
                                           local_edge_cases::local_digits2_small,
                                           boost::multiprecision::unsigned_magnitude,
                                           boost::multiprecision::unchecked,
                                           void>;

  using local_boost_small_uint_type =
    boost::multiprecision::number<local_boost_small_uint_backend_type,
                                  boost::multiprecision::et_off>;

  auto result_is_ok = true;

  static const std::array<bool, static_cast<std::size_t>(UINT8_C(2))> msv_options = { true, false };

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify import_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having the same widths.
      // Use the full bit width and representation length of uintwide_t.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;
      using local_input_value_type    = typename local_representation_type::value_type;

      auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      local_representation_type bits(u_gen.crepresentation());

      if(msv_first)
      {
        std::reverse(bits.begin(), bits.end());
      }

      local_uintwide_t_small_unsigned_type val_uintwide_t { };
      local_boost_small_uint_type          val_boost      { };

      const auto oscillated_chunk_size =
        static_cast<unsigned>
        (
          static_cast<unsigned>(i % 2U) == 0U
            ? static_cast<unsigned>(std::numeric_limits<local_input_value_type>::digits)
            : 0U
        );

      static_cast<void>(import_bits(val_uintwide_t, bits.cbegin(), bits.cend(), oscillated_chunk_size, msv_first));
      static_cast<void>(import_bits(val_boost,      bits.cbegin(), bits.cend(), oscillated_chunk_size, msv_first)); // NOLINT

      using std::to_string;

      const auto str_uintwide_t = to_string(val_uintwide_t);
      const auto str_boost      = val_boost.str();

      const auto result_import_bits_is_ok = ((str_uintwide_t == str_boost) && (u_gen == val_uintwide_t));

      result_is_ok = (result_import_bits_is_ok && result_is_ok);
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    static const std::array<unsigned, static_cast<std::size_t>(UINT8_C(3))> bits_for_chunks = { 7U, 9U, 15U };

    for(const auto& chunk_size : bits_for_chunks)
    {
      for(auto   i = static_cast<unsigned>(UINT8_C(0));
                 i < static_cast<unsigned>(loop_count_lo);
               ++i)
      {
        // Verify import_bits() and compare with Boost control value(s).
        // The input and output ranges have elements having the same widths.
        // Use various input bit counts less than the result limb's width.
        // Use the full size of elements in the wide integer for the
        // distance of the input range.

        using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

        auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

        local_representation_type bits(u_gen.crepresentation());

        if(msv_first)
        {
          std::reverse(bits.begin(), bits.end());
        }

        local_uintwide_t_small_unsigned_type val_uintwide_t { };
        local_boost_small_uint_type          val_boost      { };

        using std::to_string;

        static_cast<void>(import_bits(val_uintwide_t, bits.cbegin(), bits.cend(), chunk_size, msv_first));
        static_cast<void>(import_bits(val_boost,      bits.cbegin(), bits.cend(), chunk_size, msv_first)); // NOLINT

        const auto str_uintwide_t = to_string(val_uintwide_t);
        const auto str_boost      =           val_boost.str();

        const auto result_import_bits_is_ok = (str_uintwide_t == str_boost);

        result_is_ok = (result_import_bits_is_ok && result_is_ok);
      }
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify import_bits() and compare with Boost control value(s).
      // The input and output ranges have elements having different widths.
      // Use various input bit counts exceeding the result limb's width.
      // Use the full size of elements in the wide integer for the
      // distance of the input range.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      local_representation_type bits(u_gen.crepresentation());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using local_input_double_width_value_type =
        typename WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #else
      using local_input_double_width_value_type =
        typename ::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #endif

      using local_double_width_input_array_type =
        std::array<local_input_double_width_value_type, local_uintwide_t_small_unsigned_type::number_of_limbs / 2U>;

      local_double_width_input_array_type bits_double_width;

      {
        using local_size_type = typename local_representation_type::size_type;

        auto index = static_cast<local_size_type>(UINT8_C(0));

        for(auto& elem : bits_double_width)
        {
          #if defined(WIDE_INTEGER_NAMESPACE)
          using WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::make_large;
          #else
          using ::math::wide_integer::detail::make_large;
          #endif

          const auto index_plus_one =
            static_cast<local_size_type>
            (
              index + static_cast<local_size_type>(UINT8_C(1))
            );

          #if defined(WIDE_INTEGER_NAMESPACE)
          elem = make_large(*WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::advance_and_point(bits.cbegin(), index),
                            *WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::advance_and_point(bits.cbegin(), index_plus_one));
          #else
          elem = make_large(*::math::wide_integer::detail::advance_and_point(bits.cbegin(), index),
                            *::math::wide_integer::detail::advance_and_point(bits.cbegin(), index_plus_one));
          #endif

          index = static_cast<local_size_type>(index + static_cast<local_size_type>(UINT8_C(2)));
        }
      }

      local_uintwide_t_small_unsigned_type val_uintwide_t { };
      local_boost_small_uint_type          val_boost      { };

      using std::to_string;

      static_cast<void>(import_bits(val_uintwide_t, bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first));
      static_cast<void>(import_bits(val_boost,      bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first)); // NOLINT

      const auto str_uintwide_t = to_string(val_uintwide_t);
      const auto str_boost      =           val_boost.str();

      const auto result_import_bits_is_ok = (str_uintwide_t == str_boost);

      result_is_ok = (result_import_bits_is_ok && result_is_ok);
    }
  }

  for(const auto& msv_first : msv_options) // NOLINT
  {
    for(auto   i = static_cast<unsigned>(UINT8_C(0));
               i < static_cast<unsigned>(loop_count_lo);
             ++i)
    {
      // Verify import_bits() and compare with Boost control value(s).
      // Use various input bit counts exceeding the result limb's width.
      // Use only part of the size of elements in the wide integer for the
      // distance of the input range.

      using local_representation_type = typename local_uintwide_t_small_unsigned_type::representation_type;

      using local_input_value_type = typename local_representation_type::value_type;

      auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      using local_representation_less_wide_type =
        std::array<local_input_value_type, static_cast<std::size_t>(static_cast<std::size_t>(local_uintwide_t_small_unsigned_type::number_of_limbs) - 2U)>;

      local_representation_less_wide_type bits { };

      std::copy(u_gen.crepresentation().cbegin(),
                #if defined(WIDE_INTEGER_NAMESPACE)
                WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::advance_and_point(u_gen.crepresentation().cbegin(), std::tuple_size<local_representation_less_wide_type>::value),
                #else
                ::math::wide_integer::detail::advance_and_point(u_gen.crepresentation().cbegin(), std::tuple_size<local_representation_less_wide_type>::value),
                #endif
                bits.begin());

      #if defined(WIDE_INTEGER_NAMESPACE)
      using local_input_double_width_value_type =
        typename WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #else
      using local_input_double_width_value_type =
        typename ::math::wide_integer::detail::uint_type_helper<static_cast<std::size_t>(std::numeric_limits<local_input_value_type>::digits * 2)>::exact_unsigned_type;
      #endif

      using local_double_width_less_wide_input_array_type =
        std::array<local_input_double_width_value_type, std::tuple_size<local_representation_less_wide_type>::value / 2U>;

      static_assert(std::tuple_size<local_double_width_less_wide_input_array_type>::value == static_cast<std::size_t>(static_cast<std::size_t>(static_cast<std::size_t>(local_uintwide_t_small_unsigned_type::number_of_limbs) / 2U) - 1U),
                    "Error: Type definition widths are not OK");

      local_double_width_less_wide_input_array_type bits_double_width;

      {
        using local_size_type = typename local_representation_type::size_type;

        auto index = static_cast<local_size_type>(UINT8_C(0));

        for(auto& elem : bits_double_width)
        {
          #if defined(WIDE_INTEGER_NAMESPACE)
          using WIDE_INTEGER_NAMESPACE::math::wide_integer::detail::make_large;
          #else
          using ::math::wide_integer::detail::make_large;
          #endif

          const auto index_plus_one =
            static_cast<local_size_type>
            (
              index + static_cast<local_size_type>(UINT8_C(1))
            );

          elem = make_large(bits[index], bits[index_plus_one]); // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)

          index = static_cast<local_size_type>(index + static_cast<local_size_type>(UINT8_C(2)));
        }
      }

      local_uintwide_t_small_unsigned_type val_uintwide_t { };
      local_boost_small_uint_type          val_boost      { };

      using std::to_string;

      static_cast<void>(import_bits(val_uintwide_t, bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first));
      static_cast<void>(import_bits(val_boost,      bits_double_width.cbegin(), bits_double_width.cend(), static_cast<unsigned>(std::numeric_limits<local_input_double_width_value_type>::digits), msv_first)); // NOLINT

      const auto str_uintwide_t = to_string(val_uintwide_t);
      const auto str_boost      =           val_boost.str();

      const auto result_import_bits_is_ok = (str_uintwide_t == str_boost);

      result_is_ok = (result_import_bits_is_ok && result_is_ok);
    }
  }

  {
    // Additional verification of import_bits().

    const std::array<std::uint32_t, 1U> bits_in = { static_cast<std::uint32_t>(UINT32_C(0x5555AAAA)) };

    using chunk_sizes_array_type = std::array<unsigned, static_cast<std::size_t>(UINT8_C(4))>;

    static const chunk_sizes_array_type various_chunk_sizes =
    {
      0U, 32U, 24U, 2U
    };

    static const std::array<std::uint32_t, std::tuple_size<chunk_sizes_array_type>::value> various_import_results =
    {
      static_cast<std::uint32_t>(UINT32_C(0x5555AAAA)),
      static_cast<std::uint32_t>(UINT32_C(0x5555AAAA)),
      static_cast<std::uint32_t>(UINT32_C(0x0055AAAA)),
      static_cast<std::uint32_t>(UINT32_C(2))
    };

    for(auto i = static_cast<std::size_t>(UINT8_C(0)); i < various_chunk_sizes.size(); ++i)
    {
      auto u = local_uintwide_t_small_unsigned_type { };

      static_cast<void>
      (
        import_bits(u, bits_in.cbegin(), bits_in.cend(), various_chunk_sizes[i]) // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)
      );

      const auto result_import_is_ok = (u == various_import_results[i]); // NOLINT(cppcoreguidelines-pro-bounds-constant-array-index)

      result_is_ok = (result_import_is_ok && result_is_ok);
    }
  }

  return result_is_ok;
}